

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetStagePredictFn(void *arkode_mem,ARKStagePredictFn PredictStage)

{
  long in_RSI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeARKStepMem *)0x11261c9);
  if (local_4 == 0) {
    if ((*(int *)((long)in_stack_ffffffffffffffd8 + 0xb0) == 5) && (in_RSI != 0)) {
      arkProcessError(local_20,-0x16,"ARKode::ARKStep","ARKStepSetStagePredictFn",
                      "User-supplied predictor is incompatible with predictor method 5");
      local_4 = -0x16;
    }
    else {
      *(long *)((long)in_stack_ffffffffffffffd8 + 0x70) = in_RSI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetStagePredictFn(void *arkode_mem,
                             ARKStagePredictFn PredictStage)
{
  ARKodeMem        ark_mem;
  ARKodeARKStepMem step_mem;
  int              retval;

  /* access ARKodeARKStepMem structure and set function pointer */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetStagePredictFn",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* override predictor method 5 if non-NULL PredictStage is supplied */
  if ((step_mem->predictor == 5) && (PredictStage != NULL)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetStagePredictFn",
                    "User-supplied predictor is incompatible with predictor method 5");
    return(ARK_ILL_INPUT);
  }

  step_mem->stage_predict = PredictStage;
  return(ARK_SUCCESS);
}